

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

int lodepng::getPaletteValue(uchar *data,size_t i,int bits)

{
  uint uVar1;
  
  uVar1 = 0;
  switch(bits) {
  case 1:
    uVar1 = (uint)((data[i >> 3] >> ((uint)i & 7) & 1) != 0);
    break;
  case 2:
    return data[i >> 2] >> ((char)i * '\x02' & 6U) & 3;
  case 4:
    return data[i >> 1] >> ((byte)((uint)i << 2) & 4) & 0xf;
  case 8:
    return (int)data[i];
  }
  return uVar1;
}

Assistant:

int getPaletteValue(const unsigned char* data, size_t i, int bits) {
  if(bits == 8) return data[i];
  else if(bits == 4) return (data[i / 2] >> ((i % 2) * 4)) & 15;
  else if(bits == 2) return (data[i / 4] >> ((i % 4) * 2)) & 3;
  else if(bits == 1) return (data[i / 8] >> (i % 8)) & 1;
  else return 0;
}